

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void Qiniu_Buffer_appendEncodedString(Qiniu_Buffer *self,Qiniu_Valist *ap)

{
  uint uVar1;
  char *__s;
  undefined8 *puVar2;
  size_t cb;
  
  uVar1 = ap->items[0].gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar2 = (undefined8 *)((ulong)uVar1 + (long)ap->items[0].reg_save_area);
    ap->items[0].gp_offset = uVar1 + 8;
  }
  else {
    puVar2 = (undefined8 *)ap->items[0].overflow_arg_area;
    ap->items[0].overflow_arg_area = puVar2 + 1;
  }
  __s = (char *)*puVar2;
  cb = strlen(__s);
  Qiniu_Buffer_AppendEncodedBinary(self,__s,cb);
  return;
}

Assistant:

void Qiniu_Buffer_appendEncodedString(Qiniu_Buffer *self, Qiniu_Valist *ap)
{
	const char *v = va_arg(ap->items, const char *);
	size_t n = strlen(v);
	Qiniu_Buffer_AppendEncodedBinary(self, v, n);
}